

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O0

void __thiscall
rlottie::internal::renderer::Group::update
          (Group *this,int frameNo,VMatrix *parentMatrix,float parentAlpha,DirtyFlag *flag)

{
  bool bVar1;
  Transform *pTVar2;
  reference ppOVar3;
  VMatrix *pVVar4;
  Int *in_RCX;
  void *in_RDX;
  uint in_ESI;
  Group *in_RDI;
  float in_XMM0_Da;
  Object **content;
  iterator __end1;
  iterator __begin1;
  vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
  *__range1;
  VMatrix m;
  float alpha;
  DirtyFlag newFlag;
  VMatrix *in_stack_ffffffffffffff58;
  VMatrix *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  uint uVar5;
  bool local_89;
  __normal_iterator<rlottie::internal::renderer::Object_**,_std::vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>_>
  local_70;
  vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
  *local_68;
  vFlag<rlottie::internal::renderer::DirtyFlagBit> local_5c;
  undefined1 local_58 [8];
  VMatrix *in_stack_ffffffffffffffb0;
  VMatrix *in_stack_ffffffffffffffb8;
  float local_30;
  vFlag<rlottie::internal::renderer::DirtyFlagBit> local_2c [4];
  float local_1c;
  void *local_18;
  uint local_c;
  
  local_2c[0].i = *in_RCX;
  local_1c = in_XMM0_Da;
  local_18 = in_RDX;
  local_c = in_ESI;
  bVar1 = internal::model::Filter<rlottie::internal::model::Group>::hasModel
                    ((Filter<rlottie::internal::model::Group> *)0x162713);
  if ((bVar1) &&
     (pTVar2 = internal::model::Filter<rlottie::internal::model::Group>::transform
                         ((Filter<rlottie::internal::model::Group> *)in_stack_ffffffffffffff60),
     pTVar2 != (Transform *)0x0)) {
    internal::model::Filter<rlottie::internal::model::Group>::matrix
              ((Filter<rlottie::internal::model::Group> *)flag,newFlag.i);
    VMatrix::operator*=(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    local_5c = vFlag<rlottie::internal::renderer::DirtyFlagBit>::operator&
                         ((vFlag<rlottie::internal::renderer::DirtyFlagBit> *)
                          in_stack_ffffffffffffff58,None);
    bVar1 = vFlag<rlottie::internal::renderer::DirtyFlagBit>::operator!(&local_5c);
    local_89 = false;
    if (bVar1) {
      pTVar2 = internal::model::Filter<rlottie::internal::model::Group>::transform
                         ((Filter<rlottie::internal::model::Group> *)in_stack_ffffffffffffff60);
      bVar1 = internal::model::Object::isStatic(&pTVar2->super_Object);
      local_89 = false;
      if (!bVar1) {
        local_89 = VMatrix::operator!=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      }
    }
    if (local_89 != false) {
      vFlag<rlottie::internal::renderer::DirtyFlagBit>::operator|=(local_2c,Matrix);
    }
    memcpy(&in_RDI->mMatrix,local_58,0x26);
    internal::model::Filter<rlottie::internal::model::Group>::transform
              ((Filter<rlottie::internal::model::Group> *)in_stack_ffffffffffffff60);
    local_30 = internal::model::Transform::opacity
                         ((Transform *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                          ,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    local_30 = local_1c * local_30;
    bVar1 = vCompare(0.0,2.034838e-39);
    if (!bVar1) {
      vFlag<rlottie::internal::renderer::DirtyFlagBit>::operator|=(local_2c,Alpha);
    }
  }
  else {
    memcpy(&in_RDI->mMatrix,local_18,0x26);
    local_30 = local_1c;
  }
  local_68 = &in_RDI->mContents;
  local_70._M_current =
       (Object **)
       std::
       vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
       ::begin((vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
                *)in_stack_ffffffffffffff58);
  std::
  vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
  ::end((vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
         *)in_stack_ffffffffffffff58);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<rlottie::internal::renderer::Object_**,_std::vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>_>
                             *)in_stack_ffffffffffffff60,
                            (__normal_iterator<rlottie::internal::renderer::Object_**,_std::vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>_>
                             *)in_stack_ffffffffffffff58), bVar1) {
    ppOVar3 = __gnu_cxx::
              __normal_iterator<rlottie::internal::renderer::Object_**,_std::vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>_>
              ::operator*(&local_70);
    in_stack_ffffffffffffff60 = (VMatrix *)*ppOVar3;
    uVar5 = local_c;
    pVVar4 = matrix(in_RDI);
    (*(*(_func_int ***)in_stack_ffffffffffffff60)[2])
              (local_30,in_stack_ffffffffffffff60,(ulong)uVar5,pVVar4,local_2c);
    __gnu_cxx::
    __normal_iterator<rlottie::internal::renderer::Object_**,_std::vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>_>
    ::operator++(&local_70);
  }
  return;
}

Assistant:

void renderer::Group::update(int frameNo, const VMatrix &parentMatrix,
                             float parentAlpha, const DirtyFlag &flag)
{
    DirtyFlag newFlag = flag;
    float     alpha;

    if (mModel.hasModel() && mModel.transform()) {
        VMatrix m = mModel.matrix(frameNo);

        m *= parentMatrix;
        if (!(flag & DirtyFlagBit::Matrix) && !mModel.transform()->isStatic() &&
            (m != mMatrix)) {
            newFlag |= DirtyFlagBit::Matrix;
        }

        mMatrix = m;

        alpha = parentAlpha * mModel.transform()->opacity(frameNo);
        if (!vCompare(alpha, parentAlpha)) {
            newFlag |= DirtyFlagBit::Alpha;
        }
    } else {
        mMatrix = parentMatrix;
        alpha = parentAlpha;
    }

    for (const auto &content : mContents) {
        content->update(frameNo, matrix(), alpha, newFlag);
    }
}